

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnfMap.c
# Opt level: O1

void Cnf_CutAssignAreaFlow(Cnf_Man_t *p,Dar_Cut_t *pCut,int *pAreaFlows)

{
  uint uVar1;
  int iVar2;
  Vec_Ptr_t *pVVar3;
  void *pvVar4;
  uint uVar5;
  ulong uVar6;
  
  uVar1 = *(uint *)&pCut->field_0x4;
  uVar5 = uVar1 & 0xf800ffff;
  *(uint *)&pCut->field_0x4 = uVar5;
  uVar6 = (ulong)uVar1 & 0xffff;
  pCut->uSign = ((int)p->pSopSizes[uVar6 ^ 0xffff] + (int)p->pSopSizes[uVar6]) * 10;
  if (0x1fffffff < uVar5) {
    uVar6 = 0;
    do {
      iVar2 = pCut->pLeaves[uVar6];
      if (((long)iVar2 < 0) || (pVVar3 = p->pManAig->vObjs, pVVar3->nSize <= iVar2)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      pvVar4 = pVVar3->pArray[iVar2];
      *(uint *)&pCut->field_0x4 =
           uVar5 & 0xf800ffff |
           (*(uint *)((long)pvVar4 + 0x18) & 0x1ffc0) * 0x400 + uVar5 & 0x7ff0000;
      uVar1 = *(uint *)((long)pvVar4 + 0x18);
      if (0xfffffffd < (uVar1 & 7) - 7) {
        if (uVar1 < 0x40) {
          __assert_fail("pLeaf->nRefs > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/cnf/cnfMap.c"
                        ,0x39,"void Cnf_CutAssignAreaFlow(Cnf_Man_t *, Dar_Cut_t *, int *)");
        }
        pCut->uSign = pCut->uSign + pAreaFlows[*(int *)((long)pvVar4 + 0x24)] / (int)(uVar1 >> 6);
      }
      uVar6 = uVar6 + 1;
      uVar5 = *(uint *)&pCut->field_0x4;
    } while (uVar6 < uVar5 >> 0x1d);
  }
  return;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Computes area flow of the cut.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void Cnf_CutAssignAreaFlow( Cnf_Man_t * p, Dar_Cut_t * pCut, int * pAreaFlows )
{
    Aig_Obj_t * pLeaf;
    int i;
    pCut->Value = 0;
//    pCut->uSign = 100 * Cnf_CutSopCost( p, pCut );
    pCut->uSign = 10 * Cnf_CutSopCost( p, pCut );
    Dar_CutForEachLeaf( p->pManAig, pCut, pLeaf, i )
    {
        pCut->Value += pLeaf->nRefs;
        if ( !Aig_ObjIsNode(pLeaf) )
            continue;
        assert( pLeaf->nRefs > 0 );
        pCut->uSign += pAreaFlows[pLeaf->Id] / (pLeaf->nRefs? pLeaf->nRefs : 1);
    }
}